

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O3

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
::ConcreteMachine(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
                  *this,Target *target,ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  AY38910<false> *sample_source;
  Speaker *this_01;
  TapePlayer *tape_player;
  VIAPortHandler *this_02;
  atomic_flag *paVar1;
  ulong *puVar2;
  ulong *puVar3;
  __atomic_flag_data_type _Var4;
  int iVar5;
  DiskInterface DVar6;
  pointer pNVar7;
  Cycles cycles;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  BinaryTapePlayer *this_03;
  Target *pTVar10;
  bool bVar11;
  long lVar12;
  undefined4 *puVar13;
  byte bVar14;
  pointer pNVar15;
  long lVar16;
  pointer pNVar17;
  pointer pNVar18;
  Name name;
  Microdisc *this_04;
  pointer pNVar19;
  pointer *__ptr;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  undefined1 local_128 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_118;
  Microdisc *local_100;
  Microdisc *local_f8;
  VideoOutput *local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e0;
  BinaryTapePlayer *local_d8;
  AsyncTaskQueue<false,_true,_void> *local_d0;
  long local_c8;
  Target *local_c0;
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [8];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_a8;
  size_t local_90;
  _Any_data *local_80;
  uint8_t *local_78;
  Request local_70;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_48;
  
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00591648;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_00591610;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_00590d68;
  (this->super_JoystickMachine)._vptr_JoystickMachine =
       (_func_int **)&PTR___cxa_pure_virtual_00590d80;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_00591690;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8 = (undefined1  [8])0x0;
  auStack_b0 = (undefined1  [8])0x0;
  local_90 = 0;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_b0;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)auStack_b0;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_b8);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_b8);
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059e1f8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059e2f0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059e328;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0059e340;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0059e358;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0059e370;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059e3a0;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0059e3e0;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_0059e400;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_0059e418;
  (this->super_Delegate).super_Delegate._vptr_Delegate = (_func_int **)&DAT_0059e430;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0059e450;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059e468;
  (this->super_SpecialKeyHandler)._vptr_SpecialKeyHandler = (_func_int **)&DAT_0059e488;
  this->basic_invisible_ram_top_ = 0xffff;
  this->basic_visible_ram_top_ = 0xbfff;
  CPU::MOS6502::ProcessorStorage::ProcessorStorage((ProcessorStorage *)&this->m6502_,P6502);
  local_c8 = 0x108;
  (this->m6502_).
  super_Processor<(CPU::MOS6502::Personality)1,_Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>,_false>
  .bus_handler_ = this;
  local_e0 = &this->rom_;
  local_e8 = &this->disk_rom_;
  local_78 = this->ram_;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->tape_get_byte_address_ = 0;
  this->tape_speed_address_ = 0;
  this->keyboard_read_count_ = 0;
  (this->video_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059c2d8;
  local_f0 = &(this->video_).object_;
  VideoOutput::VideoOutput(local_f0,local_78);
  (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_ = 0;
  (this->video_).time_until_event_.super_WrappedInt<Cycles>.length_ = 0;
  (this->video_).time_overrun_.super_WrappedInt<Cycles>.length_ = 0;
  (this->video_).is_flushed_ = true;
  (this->video_).did_flush_ = false;
  (this->video_).clocking_preference_ = JustInTime;
  (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
  this_00 = &this->audio_queue_;
  local_80 = (_Any_data *)rom_fetcher;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  sample_source = &this->ay8910_;
  local_d0 = this_00;
  GI::AY38910::AY38910SampleSource<false>::AY38910SampleSource
            (&sample_source->super_AY38910SampleSource<false>,AY38910,this_00);
  (this->ay8910_).super_SampleSource<GI::AY38910::AY38910<false>,_false,_4>.master_divider_ = 0;
  this_01 = &this->speaker_;
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass(this_01,sample_source);
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_0059bd98;
  tape_player = &this->tape_player_;
  local_c0 = target;
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(&tape_player->super_BinaryTapePlayer,1000000);
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_TimedEventLoop.
  _vptr_TimedEventLoop = (_func_int **)&PTR_process_next_event_0059c308;
  (this->tape_player_).super_BinaryTapePlayer.super_TapePlayer.super_Source._vptr_Source =
       (_func_int **)&DAT_0059c348;
  (this->tape_player_).parser_.
  super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>.
  super_Parser<Storage::Tape::Oric::SymbolType>.error_flag_ = false;
  (this->tape_player_).parser_.
  super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>.
  super_Parser<Storage::Tape::Oric::SymbolType>.has_next_symbol_ = false;
  (this->tape_player_).parser_.
  super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>.
  wave_queue_.
  super__Vector_base<Storage::Tape::Oric::WaveType,_std::allocator<Storage::Tape::Oric::WaveType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tape_player_).parser_.
  super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>.
  wave_queue_.
  super__Vector_base<Storage::Tape::Oric::WaveType,_std::allocator<Storage::Tape::Oric::WaveType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tape_player_).parser_.
  super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>.
  wave_queue_.
  super__Vector_base<Storage::Tape::Oric::WaveType,_std::allocator<Storage::Tape::Oric::WaveType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tape_player_).parser_.
  super_PulseClassificationParser<Storage::Tape::Oric::WaveType,_Storage::Tape::Oric::SymbolType>.
  super_Parser<Storage::Tape::Oric::SymbolType>._vptr_Parser =
       (_func_int **)&PTR_process_pulse_005a38e0;
  this->use_fast_tape_hack_ = false;
  this_02 = &this->via_port_handler_;
  local_d8 = &tape_player->super_BinaryTapePlayer;
  VIAPortHandler::VIAPortHandler
            (this_02,local_d0,sample_source,this_01,tape_player,&this->keyboard_);
  (this->via_).super_MOS6522Storage.is_phase2_ = false;
  (this->via_).super_MOS6522Storage.registers_.output[0] = '\0';
  (this->via_).super_MOS6522Storage.registers_.output[1] = '\0';
  (this->via_).super_MOS6522Storage.registers_.input[0] = '\0';
  (this->via_).super_MOS6522Storage.registers_.input[1] = '\0';
  (this->via_).super_MOS6522Storage.registers_.data_direction[0] = '\0';
  (this->via_).super_MOS6522Storage.registers_.data_direction[1] = '\0';
  (this->via_).super_MOS6522Storage.registers_.timer[0] = 0;
  *(undefined8 *)((this->via_).super_MOS6522Storage.registers_.timer + 1) = 0;
  (this->via_).super_MOS6522Storage.registers_.last_timer[1] = 0;
  (this->via_).super_MOS6522Storage.registers_.next_timer[0] = -1;
  (this->via_).super_MOS6522Storage.registers_.next_timer[1] = -1;
  (this->via_).super_MOS6522Storage.registers_.shift = '\0';
  (this->via_).super_MOS6522Storage.registers_.auxiliary_control = '\0';
  (this->via_).super_MOS6522Storage.registers_.peripheral_control = '\0';
  (this->via_).super_MOS6522Storage.registers_.interrupt_flags = '\0';
  (this->via_).super_MOS6522Storage.registers_.interrupt_enable = '\0';
  (this->via_).super_MOS6522Storage.registers_.timer_needs_reload = false;
  (this->via_).super_MOS6522Storage.registers_.timer_port_b_output = 0xff;
  (this->via_).super_MOS6522Storage.control_inputs_[0] = (bool  [2])0x0;
  (this->via_).super_MOS6522Storage.control_inputs_[1] = (bool  [2])0x0;
  (this->via_).super_MOS6522Storage.control_outputs_[0].lines[0] = Input;
  *(undefined8 *)((this->via_).super_MOS6522Storage.control_outputs_[0].lines + 1) = 0x200000002;
  (this->via_).super_MOS6522Storage.control_outputs_[1].lines[1] = Input;
  *(undefined4 *)((long)(this->via_).super_MOS6522Storage.handshake_modes_ + 7) = 0;
  (this->via_).super_MOS6522Storage.handshake_modes_[0] = None;
  (this->via_).super_MOS6522Storage.handshake_modes_[1] = None;
  (this->via_).super_MOS6522Storage.shift_bits_remaining_ = 8;
  (this->via_).bus_handler_ = this_02;
  (this->via_).time_since_bus_handler_call_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->keyboard_).row_ = '\0';
  (this->keyboard_).special_key_handler_ = &this->super_SpecialKeyHandler;
  (this->keyboard_).rows_[0] = '\0';
  (this->keyboard_).rows_[1] = '\0';
  (this->keyboard_).rows_[2] = '\0';
  (this->keyboard_).rows_[3] = '\0';
  (this->keyboard_).rows_[4] = '\0';
  (this->keyboard_).rows_[5] = '\0';
  (this->keyboard_).rows_[6] = '\0';
  (this->keyboard_).rows_[7] = '\0';
  this_04 = &this->microdisc_;
  Microdisc::Microdisc(this_04);
  this_03 = local_d8;
  local_f8 = (Microdisc *)&this->jasmin_;
  Jasmin::Jasmin((Jasmin *)local_f8);
  this->jasmin_reset_counter_ = 0;
  local_100 = (Microdisc *)&this->bd500_;
  BD500::BD500((BD500 *)local_100);
  local_b8._0_4_ = 2000000;
  JustInTimeActor<Apple::DiskII,_Cycles,_1,_1>::JustInTimeActor<int>(&this->diskii_,(int *)local_b8)
  ;
  (this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pravetz_rom_base_pointer_ = 0;
  (this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->ram_top_ = this->basic_visible_ram_top_;
  this->paged_rom_ = (uint8_t *)0x0;
  (this->string_serialiser_)._M_t.
  super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>.
  _M_t.
  super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
  .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl = (StringSerialiser *)0x0;
  (this->super_TimedMachine).clock_rate_ = 1000000.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::set_input_rate(&this_01->
                    super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                   ,1e+06);
  MOS::MOS6522::IRQDelegatePortHandler::set_interrupt_delegate
            (&this_02->super_IRQDelegatePortHandler,&this->super_Delegate);
  Storage::Tape::BinaryTapePlayer::set_delegate(this_03,&this->super_Delegate);
  Memory::Fuzz(local_78,0x10000);
  local_c8 = (long)&(this->super_TimedMachine)._vptr_TimedMachine + local_c8;
  lVar12 = 0xe10;
  do {
    puVar2 = (ulong *)((long)&(this->super_TimedMachine)._vptr_TimedMachine + lVar12);
    uVar8 = puVar2[1];
    puVar3 = (ulong *)((long)&(this->super_TimedMachine)._vptr_TimedMachine + lVar12);
    *puVar3 = *puVar2 | 0x4040404040404040;
    puVar3[1] = uVar8 | 0x4040404040404040;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x10e10);
  ROM::Request::Request((Request *)local_128,OricColourROM,true);
  name = OricBASIC10;
  if (local_c0->rom != BASIC10) {
    name = local_c0->rom == Pravetz | OricBASIC11;
  }
  ROM::Request::Request(&local_70,name,false);
  ROM::Request::operator&&((Request *)local_b8,(Request *)local_128,&local_70);
  local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_128[8] = auStack_b0[0];
  local_128._0_8_ = local_b8;
  local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_a8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_70.node.children);
  ROM::Request::Request(&local_70,OricByteDrive500,false);
  ROM::Request::operator&&((Request *)local_b8,(Request *)local_128,&local_70);
  local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_128[8] = auStack_b0[0];
  local_128._0_8_ = local_b8;
  local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_a8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_70.node.children);
  if (*(long *)(local_80 + 1) == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)((long)local_80 + 0x18))
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_b8,local_80,(Request *)local_128);
  bVar11 = ROM::Request::validate((Request *)local_128,(Map *)local_b8);
  if (!bVar11) {
    puVar13 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar13 = 0;
    __cxa_throw(puVar13,&ROMMachine::Error::typeinfo,0);
  }
  pNVar18 = (pointer)auStack_b0;
  pNVar7 = local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar19 = (pointer)auStack_b0;
  if (local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    do {
      pNVar17 = pNVar19;
      pNVar15 = pNVar7;
      iVar5 = *(int *)&(pNVar15->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar19 = pNVar15;
      if (iVar5 < 0x48) {
        pNVar19 = pNVar17;
      }
      pNVar7 = (&(pNVar15->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start)[iVar5 < 0x48];
    } while (pNVar7 != (pointer)0x0);
    if (pNVar19 != (pointer)auStack_b0) {
      if (iVar5 < 0x48) {
        pNVar15 = pNVar17;
      }
      if (*(int *)&(pNVar15->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage < 0x49) {
        LOCK();
        paVar1 = &(this->video_).flush_concurrency_check_;
        _Var4 = (paVar1->super___atomic_flag_base)._M_i;
        (paVar1->super___atomic_flag_base)._M_i = true;
        UNLOCK();
        if (_Var4 != false) {
          __assert_fail("!flush_concurrency_check_.test_and_set()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Oric/../../ClockReceiver/JustInTime.hpp"
                        ,0x7e,
                        "auto JustInTimeActor<Oric::VideoOutput, Cycles>::operator->() [T = Oric::VideoOutput, LocalTimeScale = Cycles, multiplier = 1, divider = 1]"
                       );
        }
        if ((this->video_).is_flushed_ == false) {
          (this->video_).is_flushed_ = true;
          (this->video_).did_flush_ = true;
          cycles.super_WrappedInt<Cycles>.length_ =
               (WrappedInt<Cycles>)
               (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_;
          (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_ = 0;
          VideoOutput::run_for(local_f0,cycles);
        }
        LOCK();
        (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
        UNLOCK();
        VideoOutput::set_colour_rom
                  (local_f0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar19 + 1));
      }
    }
    pNVar7 = local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar19 = (pointer)auStack_b0;
    if (local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      do {
        pNVar17 = pNVar19;
        pNVar15 = pNVar7;
        iVar5 = *(int *)&(pNVar15->children).
                         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pNVar19 = pNVar15;
        if (iVar5 < (int)name) {
          pNVar19 = pNVar17;
        }
        pNVar7 = (&(pNVar15->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start)[iVar5 < (int)name];
      } while (pNVar7 != (pointer)0x0);
      if (pNVar19 != (pointer)auStack_b0) {
        if (iVar5 < (int)name) {
          pNVar15 = pNVar17;
        }
        pNVar18 = pNVar19;
        if ((int)name <
            *(int *)&(pNVar15->children).
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage) {
          pNVar18 = (pointer)auStack_b0;
        }
      }
    }
  }
  pvVar9 = local_e0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_e0,pNVar18 + 1);
  pNVar18 = (pointer)auStack_b0;
  pNVar7 = local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar19 = (pointer)auStack_b0;
  if (local_a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    do {
      pNVar15 = pNVar7;
      pNVar17 = pNVar18;
      iVar5 = *(int *)&(pNVar15->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar18 = pNVar15;
      if (iVar5 < 0x4c) {
        pNVar18 = pNVar17;
      }
      pNVar7 = (&(pNVar15->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start)[iVar5 < 0x4c];
    } while (pNVar7 != (pointer)0x0);
    if (pNVar18 != (pointer)auStack_b0) {
      if (iVar5 < 0x4c) {
        pNVar15 = pNVar17;
      }
      if (*(int *)&(pNVar15->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage < 0x4d) {
        pNVar19 = pNVar18;
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_e8,pNVar19 + 1);
  pTVar10 = local_c0;
  this->paged_rom_ =
       (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  DVar6 = local_c0->disk_interface;
  if (DVar6 == Microdisc) {
    lVar12 = 0x128a8;
    lVar16 = 0x128b0;
  }
  else if (DVar6 == Jasmin) {
    lVar12 = 0x12da8;
    lVar16 = 0x12db0;
    this_04 = local_f8;
  }
  else {
    if (DVar6 != BD500) goto LAB_0037e45b;
    lVar12 = 0x132a8;
    lVar16 = 0x132b0;
    this_04 = local_100;
  }
  *(long *)((long)&(this->super_TimedMachine)._vptr_TimedMachine + lVar16) = local_c8;
  *(long *)((long)&(this->super_TimedMachine)._vptr_TimedMachine + lVar12) = local_c8;
  (*(this->super_Delegate).super_Delegate._vptr_Delegate[1])(local_c8,this_04);
LAB_0037e45b:
  if ((pTVar10->loading_command)._M_string_length != 0) {
    type_string(this,&pTVar10->loading_command);
  }
  if (pTVar10->should_start_jasmin == true) {
    this->jasmin_reset_counter_ = 3000000;
  }
  if (pTVar10->rom < (Pravetz|BASIC11)) {
    bVar14 = (byte)(pTVar10->rom << 4);
    this->tape_get_byte_address_ = (uint16_t)(0xe6c9e6c9e630 >> (bVar14 & 0x3f));
    this->tape_speed_address_ = (uint16_t)(0x24d024d0067 >> (bVar14 & 0x3f));
  }
  insert_media(this,&(pTVar10->super_Target).media);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_b8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_118);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::Oric::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
				m6502_(*this),
				video_(ram_),
				ay8910_(GI::AY38910::Personality::AY38910, audio_queue_),
				speaker_(ay8910_),
				via_port_handler_(audio_queue_, ay8910_, speaker_, tape_player_, keyboard_),
				via_(via_port_handler_),
				keyboard_(this),
				diskii_(2000000) {
			set_clock_rate(1000000);
			speaker_.set_input_rate(1000000.0f);
			via_port_handler_.set_interrupt_delegate(this);
			tape_player_.set_delegate(this);

			// Slight hack here: I'm unclear what RAM should look like at startup.
			// Actually, I think completely random might be right since the Microdisc
			// sort of assumes it, but also the BD-500 never explicitly sets PAL mode
			// so I can't have any switch-to-NTSC bytes in the display area. Hence:
			// disallow all atributes.
			Memory::Fuzz(ram_, sizeof(ram_));
			for(size_t c = 0; c < sizeof(ram_); ++c) {
				ram_[c] |= 0x40;
			}

			::ROM::Request request = ::ROM::Request(::ROM::Name::OricColourROM, true);
			::ROM::Name basic;
			switch(target.rom) {
				case Analyser::Static::Oric::Target::ROM::BASIC10:	basic = ::ROM::Name::OricBASIC10;		break;
				default:
				case Analyser::Static::Oric::Target::ROM::BASIC11:	basic = ::ROM::Name::OricBASIC11;		break;
				case Analyser::Static::Oric::Target::ROM::Pravetz:	basic = ::ROM::Name::OricPravetzBASIC;	break;
			}
			request = request && ::ROM::Request(basic);

			switch(disk_interface) {
				default: break;
				case DiskInterface::BD500:
					request = request && ::ROM::Request(::ROM::Name::OricByteDrive500);
				break;
				case DiskInterface::Jasmin:
					request = request && ::ROM::Request(::ROM::Name::OricJasmin);
				break;
				case DiskInterface::Microdisc:
					request = request && ::ROM::Request(::ROM::Name::OricMicrodisc);
				break;
				case DiskInterface::Pravetz:
					request = request && ::ROM::Request(::ROM::Name::Oric8DOSBoot) && ::ROM::Request(::ROM::Name::DiskIIStateMachine16Sector);
				break;
			}

			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// The colour ROM is optional; an alternative composite encoding can be used if
			// it is absent.
			const auto colour_rom = roms.find(::ROM::Name::OricColourROM);
			if(colour_rom != roms.end()) {
				video_->set_colour_rom(colour_rom->second);
			}
			rom_ = std::move(roms.find(basic)->second);

			switch(disk_interface) {
				default: break;
				case DiskInterface::BD500:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricByteDrive500)->second);
				break;
				case DiskInterface::Jasmin:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricJasmin)->second);
				break;
				case DiskInterface::Microdisc:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricMicrodisc)->second);
				break;
				case DiskInterface::Pravetz: {
					pravetz_rom_ = std::move(roms.find(::ROM::Name::Oric8DOSBoot)->second);
					pravetz_rom_.resize(512);

					diskii_->set_state_machine(roms.find(::ROM::Name::DiskIIStateMachine16Sector)->second);
				} break;
			}

			paged_rom_ = rom_.data();

			switch(target.disk_interface) {
				default: break;
				case DiskInterface::BD500:
					bd500_.set_delegate(this);
				break;
				case DiskInterface::Jasmin:
					jasmin_.set_delegate(this);
				break;
				case DiskInterface::Microdisc:
					microdisc_.set_delegate(this);
				break;
			}

			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			if(target.should_start_jasmin) {
				// If Jasmin autostart is requested then plan to do so in 3 seconds; empirically long enough
				// for the Oric to boot normally, before the Jasmin intercedes.
				jasmin_reset_counter_ = 3000000;
			}

			switch(target.rom) {
				case Analyser::Static::Oric::Target::ROM::BASIC10:
					tape_get_byte_address_ = 0xe630;
					tape_speed_address_ = 0x67;
				break;
				case Analyser::Static::Oric::Target::ROM::BASIC11:
				case Analyser::Static::Oric::Target::ROM::Pravetz:
					tape_get_byte_address_ = 0xe6c9;
					tape_speed_address_ = 0x024d;
				break;
			}

			insert_media(target.media);
		}